

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::glyphEntry(GrpParser *this)

{
  RefAST *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  RefAST RVar4;
  NoViableAltException *pNVar5;
  RefAST *child;
  RefAST glyphEntry_AST;
  ASTPair currentAST;
  RefAST tmp92_AST;
  RefCount<AST> local_80;
  ASTPair local_78;
  RefCount<Token> local_68;
  ASTFactory local_60;
  RefToken local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_80.ref = nullAST.ref;
  local_78.root.ref = (Ref *)0x0;
  local_78.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_80.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar2 == 0xd) {
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar1 = BitSet::member(&_tokenSet_22,iVar2);
    if (!bVar1) goto LAB_001904cc;
    glyphContents(this);
    local_38.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_38.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    child = &local_38;
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_78,child);
  }
  else {
LAB_001904cc:
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar2 != 0xd) {
LAB_0019064d:
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_48);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar2 != 0xb) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar2 != 0x12) goto LAB_0019064d;
    }
    glyphAttrs(this);
    local_40.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_40.ref == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    child = &local_40;
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_78,child);
  }
  RefCount<AST>::~RefCount(child);
  uVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar4 = nullAST;
  if (uVar3 < 0x10) {
    if ((0xe600U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 != 8) goto LAB_00190697;
      if (nullAST.ref == (Ref *)0x0) {
        RVar4.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_60.nodeFactory = (factory_type)RVar4.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
      ASTFactory::create(&local_60,(RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
      RefCount<AST>::operator=((RefCount<AST> *)&local_60.nodeFactory,(RefCount<AST> *)&local_60);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_60);
      RefCount<Token>::~RefCount(&local_68);
      Parser::match((Parser *)this,8);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_60.nodeFactory);
    }
    RefCount<AST>::operator=(&local_80,&local_78.root);
    RefCount<AST>::operator=(this_00,&local_80);
    RefCount<AST>::~RefCount(&local_80);
    RefCount<AST>::~RefCount(&local_78.child);
    RefCount<AST>::~RefCount(&local_78.root);
    return;
  }
LAB_00190697:
  pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
  NoViableAltException::NoViableAltException(pNVar5,&local_50);
  __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::glyphEntry() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphEntry_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT) && (_tokenSet_22.member(LA(2)))) {
			glyphContents();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==IDENT) && (LA(2)==OP_LBRACE||LA(2)==OP_DOT)) {
			glyphAttrs();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp92_AST = nullAST;
			tmp92_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphEntry_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_21);
	}
	returnAST = glyphEntry_AST;
}